

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O3

int unlzw(FILE *in,FILE *out)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  int iVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [11];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  long lVar30;
  ulong uVar31;
  long lVar32;
  size_t sVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  ush *puVar38;
  ulong uVar39;
  uint uVar40;
  ush *puVar41;
  int iVar42;
  ush *puVar43;
  char *err_message;
  long lVar44;
  voidp pvVar45;
  voidp buf;
  ush *puVar46;
  uint uVar47;
  long lVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar59;
  undefined1 auVar52 [16];
  undefined1 auVar60 [11];
  char cVar66;
  byte bVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ush *local_78;
  ulong local_60;
  ush *puVar48;
  undefined1 auVar61 [15];
  char cVar64;
  byte bVar65;
  
  uVar31 = (ulong)inptr;
  ofd = out;
  if (inptr < insize) {
    inptr = inptr + 1;
    maxbits = (int)inbuf[uVar31];
  }
  else {
    maxbits = fill_inbuf((int)in);
  }
  block_mode = maxbits & 0x80;
  if ((maxbits & 0x60U) != 0) {
    ffpmsg(ifname);
    ffpmsg("warning, unknown flags in unlzw decompression");
  }
  iVar17 = block_mode;
  maxbits = maxbits & 0x1f;
  uVar31 = 1L << (sbyte)maxbits;
  if (0x10 < (uint)maxbits) {
    ffpmsg(ifname);
    err_message = "compressed with too many bits; cannot handle file";
LAB_001c5e35:
    ffpmsg(err_message);
    return 1;
  }
  sVar33 = (size_t)insize;
  uVar40 = inptr << 3;
  lVar49 = 0x100;
  memset(prev,0,0x100);
  auVar51 = _DAT_002032e0;
  do {
    cVar59 = auVar51[7];
    auVar18[0xd] = 0;
    auVar18._0_13_ = auVar51._0_13_;
    auVar18[0xe] = cVar59;
    cVar58 = auVar51[6];
    auVar19[0xc] = cVar58;
    auVar19._0_12_ = auVar51._0_12_;
    auVar19._13_2_ = auVar18._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar51._0_11_;
    auVar20._12_3_ = auVar19._12_3_;
    cVar57 = auVar51[5];
    auVar21[10] = cVar57;
    auVar21._0_10_ = auVar51._0_10_;
    auVar21._11_4_ = auVar20._11_4_;
    auVar22[9] = 0;
    auVar22._0_9_ = auVar51._0_9_;
    auVar22._10_5_ = auVar21._10_5_;
    cVar56 = auVar51[4];
    auVar23[8] = cVar56;
    auVar23._0_8_ = auVar51._0_8_;
    auVar23._9_6_ = auVar22._9_6_;
    auVar52[7] = 0;
    auVar52._0_7_ = auVar23._8_7_;
    auVar26._7_8_ = 0;
    auVar26._0_7_ = auVar23._8_7_;
    cVar55 = auVar51[3];
    auVar28._1_8_ = SUB158(auVar26 << 0x40,7);
    auVar28[0] = cVar55;
    auVar28._9_6_ = 0;
    cVar54 = auVar51[2];
    auVar27._1_10_ = SUB1510(auVar28 << 0x30,5);
    auVar27[0] = cVar54;
    auVar29._11_4_ = 0;
    auVar29._0_11_ = auVar27;
    cVar53 = auVar51[1];
    auVar24[2] = cVar53;
    auVar24._0_2_ = auVar51._0_2_;
    auVar24._3_12_ = SUB1512(auVar29 << 0x20,3);
    auVar25._2_13_ = auVar24._2_13_;
    auVar25._0_2_ = auVar51._0_2_ & 0xff;
    auVar52._8_4_ = auVar25._0_4_;
    auVar52._12_4_ = auVar27._0_4_;
    auVar52 = pshuflw(auVar52,auVar52,0x1b);
    auVar52 = pshufhw(auVar52,auVar52,0x1b);
    auVar62[8] = auVar51[8];
    auVar62[9] = 0;
    cVar64 = auVar51[9];
    auVar62[10] = cVar64;
    bVar65 = auVar51[10];
    cVar66 = auVar51[0xb];
    bVar67 = auVar51[0xc];
    auVar60._0_10_ = (unkuint10)bVar67 << 0x40;
    cVar68 = auVar51[0xd];
    auVar60[10] = cVar68;
    auVar61[0xb] = 0;
    auVar61._0_11_ = auVar60;
    cVar69 = auVar51[0xe];
    auVar61[0xc] = cVar69;
    auVar61[0xd] = 0;
    cVar70 = auVar51[0xf];
    auVar61[0xe] = cVar70;
    auVar62[3] = 0;
    auVar62._0_3_ = auVar60._8_3_;
    auVar62._4_3_ = auVar61._12_3_;
    auVar62[7] = 0;
    auVar62[0xb] = 0;
    auVar62._12_3_ = (int3)(CONCAT16(cVar66,(uint6)bVar65 << 0x20) >> 0x20);
    auVar62[0xf] = 0;
    auVar63 = pshuflw(auVar62,auVar62,0x1b);
    auVar63 = pshufhw(auVar63,auVar63,0x1b);
    sVar1 = auVar63._0_2_;
    sVar2 = auVar63._2_2_;
    sVar3 = auVar63._4_2_;
    sVar4 = auVar63._6_2_;
    sVar5 = auVar63._8_2_;
    sVar6 = auVar63._10_2_;
    sVar7 = auVar63._12_2_;
    sVar8 = auVar63._14_2_;
    sVar9 = auVar52._0_2_;
    sVar10 = auVar52._2_2_;
    sVar11 = auVar52._4_2_;
    sVar12 = auVar52._6_2_;
    sVar13 = auVar52._8_2_;
    sVar14 = auVar52._10_2_;
    sVar15 = auVar52._12_2_;
    sVar16 = auVar52._14_2_;
    *(char *)((long)prev + lVar49 + 0x1fff0) =
         (0 < sVar1) * (sVar1 < 0x100) * auVar63[0] - (0xff < sVar1);
    *(char *)((long)prev + lVar49 + 0x1fff1) =
         (0 < sVar2) * (sVar2 < 0x100) * auVar63[2] - (0xff < sVar2);
    *(char *)((long)prev + lVar49 + 0x1fff2) =
         (0 < sVar3) * (sVar3 < 0x100) * auVar63[4] - (0xff < sVar3);
    *(char *)((long)prev + lVar49 + 0x1fff3) =
         (0 < sVar4) * (sVar4 < 0x100) * auVar63[6] - (0xff < sVar4);
    *(char *)((long)prev + lVar49 + 0x1fff4) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar63[8] - (0xff < sVar5);
    *(char *)((long)prev + lVar49 + 0x1fff5) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar63[10] - (0xff < sVar6);
    *(char *)((long)prev + lVar49 + 0x1fff6) =
         (0 < sVar7) * (sVar7 < 0x100) * auVar63[0xc] - (0xff < sVar7);
    *(char *)((long)prev + lVar49 + 0x1fff7) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar63[0xe] - (0xff < sVar8);
    *(char *)((long)prev + lVar49 + 0x1fff8) =
         (0 < sVar9) * (sVar9 < 0x100) * auVar52[0] - (0xff < sVar9);
    *(char *)((long)prev + lVar49 + 0x1fff9) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar52[2] - (0xff < sVar10);
    *(char *)((long)prev + lVar49 + 0x1fffa) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar52[4] - (0xff < sVar11);
    *(char *)((long)prev + lVar49 + 0x1fffb) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar52[6] - (0xff < sVar12);
    *(char *)((long)prev + lVar49 + 0x1fffc) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar52[8] - (0xff < sVar13);
    *(char *)((long)prev + lVar49 + 0x1fffd) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar52[10] - (0xff < sVar14);
    *(char *)((long)prev + lVar49 + 0x1fffe) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar52[0xc] - (0xff < sVar15);
    *(char *)((long)prev + lVar49 + 0x1ffff) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar52[0xe] - (0xff < sVar16);
    auVar51[0] = auVar51[0] + -0x10;
    auVar51[1] = cVar53 + -0x10;
    auVar51[2] = cVar54 + -0x10;
    auVar51[3] = cVar55 + -0x10;
    auVar51[4] = cVar56 + -0x10;
    auVar51[5] = cVar57 + -0x10;
    auVar51[6] = cVar58 + -0x10;
    auVar51[7] = cVar59 + -0x10;
    auVar51[8] = auVar62[8] - 0x10;
    auVar51[9] = cVar64 + -0x10;
    auVar51[10] = bVar65 - 0x10;
    auVar51[0xb] = cVar66 + -0x10;
    auVar51[0xc] = bVar67 - 0x10;
    auVar51[0xd] = cVar68 + -0x10;
    auVar51[0xe] = cVar69 + -0x10;
    auVar51[0xf] = cVar70 + -0x10;
    lVar49 = lVar49 + -0x10;
  } while (lVar49 != 0);
  uVar39 = (ulong)uVar40;
  lVar49 = 0x101 - (ulong)(iVar17 == 0);
  uVar50 = 9;
  local_60 = 0x1ff;
  uVar40 = 0x1ff;
  local_78 = (ush *)0x0;
  puVar43 = (ush *)0xffffffffffffffff;
  pvVar45 = (voidp)0x0;
LAB_001c59ba:
  iVar17 = (int)uVar50;
  lVar32 = (long)iVar17;
  buf = pvVar45;
  puVar48 = puVar43;
  do {
    iVar42 = (int)(uVar39 >> 3);
    insize = insize - iVar42;
    if (0 < (int)insize) {
      uVar39 = 0;
      do {
        lVar36 = (long)iVar42 + uVar39;
        puVar43 = (ush *)CONCAT71((int7)((ulong)lVar36 >> 8),inbuf[lVar36]);
        inbuf[uVar39] = inbuf[lVar36];
        uVar39 = uVar39 + 1;
      } while (insize != uVar39);
    }
    if (insize < 0x40) {
      puVar43 = (ush *)0x1;
      sVar33 = fread(inbuf + insize,1,0x8000,(FILE *)in);
      iVar42 = (int)sVar33;
      if (iVar42 == -1) {
        ffpmsg(ifname);
        err_message = "unexpected end of file";
        goto LAB_001c5e35;
      }
      insize = insize + iVar42;
      bytes_in = bytes_in + iVar42;
    }
    uVar39 = (ulong)insize;
    if ((int)sVar33 == 0) {
      lVar36 = uVar39 * 8 - (long)(iVar17 + -1);
    }
    else {
      lVar36 = (uVar39 - uVar39 % uVar50) * 8;
    }
    if (lVar36 < 1) {
      uVar39 = 0;
    }
    else {
      lVar34 = 0;
      pvVar45 = buf;
      do {
        puVar43 = puVar48;
        uVar39 = (ulong)(int)pvVar45;
        lVar44 = uVar39 << 0x20;
        lVar30 = lVar34;
        puVar41 = puVar43;
        buf = pvVar45;
        puVar46 = local_78;
        while( true ) {
          lVar37 = lVar30;
          if ((long)local_60 < lVar49) {
            lVar32 = lVar34 + iVar17 * 8 + -1;
            uVar40 = iVar17 + 1;
            uVar50 = (ulong)uVar40;
            uVar39 = lVar32 - lVar32 % (long)(iVar17 * 8);
            local_60 = ~(-1L << ((byte)uVar40 & 0x3f));
            if (uVar40 == maxbits) {
              local_60 = uVar31;
            }
            uVar40 = ~(-1 << ((byte)uVar40 & 0x1f));
            goto LAB_001c59ba;
          }
          uVar47 = *(uint3 *)(inbuf + (lVar37 >> 3)) >> ((byte)lVar37 & 7) & uVar40;
          puVar48 = (ush *)(ulong)uVar47;
          if (puVar41 != (ush *)0xffffffffffffffff) break;
          if (0xff < uVar47) goto LAB_001c5e22;
          outbuf[uVar39] = (uch)uVar47;
          uVar39 = uVar39 + 1;
          lVar44 = lVar44 + 0x100000000;
          buf = (voidp)(ulong)((int)buf + 1);
          lVar30 = lVar32 + lVar37;
          puVar41 = puVar48;
          puVar46 = puVar48;
          if (lVar36 <= lVar32 + lVar37) {
            uVar39 = lVar37 + lVar32;
            local_78 = puVar48;
            goto LAB_001c5cfa;
          }
        }
        if ((uVar47 == 0x100) && (block_mode != 0)) {
          memset(prev,0,0x100);
          lVar49 = 0x100;
          lVar32 = lVar37 + lVar32 + (iVar17 << 3) + -1;
          uVar39 = lVar32 - lVar32 % (long)(iVar17 << 3);
          uVar40 = 0x1ff;
          local_60 = 0x1ff;
          uVar50 = 9;
          puVar43 = puVar41;
          pvVar45 = buf;
          local_78 = puVar46;
          goto LAB_001c59ba;
        }
        lVar34 = 0x37d63e;
        puVar38 = puVar48;
        if (lVar49 <= (long)puVar48) {
          if (lVar49 < (long)puVar48) {
            if (0 < (long)uVar39) {
              write_buf(buf,(uint)puVar43);
              bytes_out = bytes_out + (uVar39 & 0xffffffff);
            }
LAB_001c5e22:
            ffpmsg(ifname);
            err_message = "corrupt input.";
            goto LAB_001c5e35;
          }
          d_buf[0x7ffe]._1_1_ = SUB81(puVar46,0);
          lVar34 = 0x37d63d;
          puVar38 = puVar41;
        }
        if ((ush *)0xff < puVar38) {
          puVar43 = prev;
          do {
            *(char *)(lVar34 + -1) = (char)puVar38[0x1ac720];
            lVar34 = lVar34 + -1;
            puVar38 = (ush *)(ulong)prev[(long)puVar38];
          } while ((ush *)0xff < puVar38);
        }
        bVar65 = (byte)puVar38[0x1ac720];
        local_78 = (ush *)(ulong)bVar65;
        puVar46 = (ush *)(lVar34 + -1);
        *(byte *)(lVar34 + -1) = bVar65;
        uVar35 = 0x37d63e - (int)puVar46;
        uVar47 = ((int)buf - (int)lVar34) + 0x37d63f;
        if ((int)uVar47 < 0x4000) {
          memcpy(outbuf + (lVar44 >> 0x20),puVar46,(long)(int)uVar35);
          puVar43 = puVar46;
          buf = (voidp)(ulong)uVar47;
        }
        else {
          do {
            iVar42 = (int)buf;
            uVar47 = 0x4000U - iVar42;
            if ((int)uVar35 < (int)(0x4000U - iVar42)) {
              uVar47 = uVar35;
            }
            if (0 < (int)uVar47) {
              puVar43 = puVar46;
              memcpy(outbuf + iVar42,puVar46,(ulong)uVar47);
              buf = (voidp)(ulong)(iVar42 + uVar47);
            }
            if (0x3fff < (int)buf) {
              write_buf(buf,(uint)puVar43);
              bytes_out = bytes_out + (long)buf;
              buf = (voidp)0x0;
            }
            puVar46 = (ush *)((long)puVar46 + (long)(int)uVar47);
            uVar35 = 0x37d63e - (int)puVar46;
          } while (0 < (int)uVar35);
        }
        if (lVar49 < (long)uVar31) {
          prev[lVar49] = (ush)puVar41;
          window[lVar49] = bVar65;
          lVar49 = lVar49 + 1;
        }
        lVar34 = lVar32 + lVar37;
        pvVar45 = buf;
      } while (lVar34 < lVar36);
      uVar39 = lVar37 + lVar32;
    }
LAB_001c5cfa:
    if ((int)sVar33 == 0) {
      if ((int)buf < 1) {
        return 0;
      }
      write_buf(buf,(uint)puVar43);
      bytes_out = bytes_out + (long)buf;
      return 0;
    }
  } while( true );
}

Assistant:

local int unlzw(FILE *in, FILE *out) 
    /* input and output file descriptors */
{
    REG2   char_type  *stackp;
    REG3   code_int   code;
    REG4   int        finchar;
    REG5   code_int   oldcode;
    REG6   code_int   incode;
    REG7   long       inbits;
    REG8   long       posbits;
    REG9   int        outpos;
/*  REG10  int        insize; (global) */
    REG11  unsigned   bitmask;
    REG12  code_int   free_ent;
    REG13  code_int   maxcode;
    REG14  code_int   maxmaxcode;
    REG15  int        n_bits;
    REG16  int        rsize;
    
    ofd = out;

#ifdef MAXSEG_64K
    tab_prefix[0] = tab_prefix0;
    tab_prefix[1] = tab_prefix1;
#endif
    maxbits = get_byte();
    block_mode = maxbits & BLOCK_MODE;
    if ((maxbits & LZW_RESERVED) != 0) {
	error( "warning, unknown flags in unlzw decompression");
    }
    maxbits &= BIT_MASK;
    maxmaxcode = MAXCODE(maxbits);
    
    if (maxbits > BITS) {
	error("compressed with too many bits; cannot handle file");
	exit_code = ERROR;
	return ERROR;
    }
    rsize = insize;
    maxcode = MAXCODE(n_bits = INIT_BITS)-1;
    bitmask = (1<<n_bits)-1;
    oldcode = -1;
    finchar = 0;
    outpos = 0;
    posbits = inptr<<3;

    free_ent = ((block_mode) ? FIRST : 256);
    
    clear_tab_prefixof(); /* Initialize the first 256 entries in the table. */
    
    for (code = 255 ; code >= 0 ; --code) {
	tab_suffixof(code) = (char_type)code;
    }
    do {
	REG1 int i;
	int  e;
	int  o;
	
    resetbuf:
	e = insize-(o = (posbits>>3));
	
	for (i = 0 ; i < e ; ++i) {
	    inbuf[i] = inbuf[i+o];
	}
	insize = e;
	posbits = 0;
	
	if (insize < INBUF_EXTRA) {
/*  modified to use fread instead of read - WDP 10/22/97  */
/*	    if ((rsize = read(in, (char*)inbuf+insize, INBUFSIZ)) == EOF) { */

	    if ((rsize = fread((char*)inbuf+insize, 1, INBUFSIZ, in)) == EOF) {
		error("unexpected end of file");
	        exit_code = ERROR;
                return ERROR;
	    }
	    insize += rsize;
	    bytes_in += (ulg)rsize;
	}
	inbits = ((rsize != 0) ? ((long)insize - insize%n_bits)<<3 : 
		  ((long)insize<<3)-(n_bits-1));
	
	while (inbits > posbits) {
	    if (free_ent > maxcode) {
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		++n_bits;
		if (n_bits == maxbits) {
		    maxcode = maxmaxcode;
		} else {
		    maxcode = MAXCODE(n_bits)-1;
		}
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    input(inbuf,posbits,code,n_bits,bitmask);
	    Tracev((stderr, "%d ", code));

	    if (oldcode == -1) {
		if (code >= 256) {
                    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;
                }

		outbuf[outpos++] = (char_type)(finchar = (int)(oldcode=code));
		continue;
	    }
	    if (code == CLEAR && block_mode) {
		clear_tab_prefixof();
		free_ent = FIRST - 1;
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		maxcode = MAXCODE(n_bits = INIT_BITS)-1;
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    incode = code;
	    stackp = de_stack;
	    
	    if (code >= free_ent) { /* Special case for KwKwK string. */
		if (code > free_ent) {
		    if (outpos > 0) {
			write_buf((char*)outbuf, outpos);
			bytes_out += (ulg)outpos;
		    }
		    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;

		}
		*--stackp = (char_type)finchar;
		code = oldcode;
	    }

	    while ((cmp_code_int)code >= (cmp_code_int)256) {
		/* Generate output characters in reverse order */
		*--stackp = tab_suffixof(code);
		code = tab_prefixof(code);
	    }
	    *--stackp =	(char_type)(finchar = tab_suffixof(code));
	    
	    /* And put them out in forward order */
	    {
	/*	REG1 int	i;   already defined above (WDP) */
	    
		if (outpos+(i = (de_stack-stackp)) >= OUTBUFSIZ) {
		    do {
			if (i > OUTBUFSIZ-outpos) i = OUTBUFSIZ-outpos;

			if (i > 0) {
			    memcpy(outbuf+outpos, stackp, i);
			    outpos += i;
			}
			if (outpos >= OUTBUFSIZ) {
			    write_buf((char*)outbuf, outpos);
			    bytes_out += (ulg)outpos;
			    outpos = 0;
			}
			stackp+= i;
		    } while ((i = (de_stack-stackp)) > 0);
		} else {
		    memcpy(outbuf+outpos, stackp, i);
		    outpos += i;
		}
	    }

	    if ((code = free_ent) < maxmaxcode) { /* Generate the new entry. */

		tab_prefixof(code) = (unsigned short)oldcode;
		tab_suffixof(code) = (char_type)finchar;
		free_ent = code+1;
	    } 
	    oldcode = incode;	/* Remember previous code.	*/
	}
    } while (rsize != 0);
    
    if (outpos > 0) {
	write_buf((char*)outbuf, outpos);
	bytes_out += (ulg)outpos;
    }
    return OK;
}